

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O2

void Diligent::CreateDefaultShaderSourceStreamFactory
               (Char *SearchDirectories,
               IShaderSourceInputStreamFactory **ppShaderSourceStreamFactory)

{
  DefaultShaderSourceStreamFactory *this;
  Char *SearchDirectories_local;
  string msg;
  
  SearchDirectories_local = SearchDirectories;
  if (ppShaderSourceStreamFactory == (IShaderSourceInputStreamFactory **)0x0) {
    FormatString<char[46]>(&msg,(char (*) [46])"ppShaderSourceStreamFactory must not be null.");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateDefaultShaderSourceStreamFactory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
               ,0x7e);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (*ppShaderSourceStreamFactory != (IShaderSourceInputStreamFactory *)0x0) {
    FormatString<char[95]>
              (&msg,(char (*) [95])
                    "*ppShaderSourceStreamFactory is not null. Make sure the pointer is null to avoid memory leaks."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateDefaultShaderSourceStreamFactory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
               ,0x7f);
    std::__cxx11::string::~string((string *)&msg);
  }
  msg._M_dataplus._M_p = (pointer)GetRawAllocator();
  msg._M_string_length = 0;
  msg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_47dc74;
  msg.field_2._8_8_ = anon_var_dwarf_47dc06;
  this = MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,Diligent::IMemoryAllocator>::
         operator()((MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,Diligent::IMemoryAllocator>
                     *)&msg,&SearchDirectories_local);
  DefaultShaderSourceStreamFactory::QueryInterface
            (this,(INTERFACE_ID *)IID_IShaderSourceInputStreamFactory,
             (IObject **)ppShaderSourceStreamFactory);
  return;
}

Assistant:

void CreateDefaultShaderSourceStreamFactory(const Char*                       SearchDirectories,
                                            IShaderSourceInputStreamFactory** ppShaderSourceStreamFactory)
{
    DEV_CHECK_ERR(ppShaderSourceStreamFactory != nullptr, "ppShaderSourceStreamFactory must not be null.");
    DEV_CHECK_ERR(*ppShaderSourceStreamFactory == nullptr, "*ppShaderSourceStreamFactory is not null. Make sure the pointer is null to avoid memory leaks.");

    auto& Allocator = GetRawAllocator();
    auto* pStreamFactory =
        NEW_RC_OBJ(Allocator, "DefaultShaderSourceStreamFactory instance", DefaultShaderSourceStreamFactory)(SearchDirectories);
    pStreamFactory->QueryInterface(IID_IShaderSourceInputStreamFactory, reinterpret_cast<IObject**>(ppShaderSourceStreamFactory));
}